

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqGrNode.cc
# Opt level: O1

void * EqGrNode::bsearch(void *__key,void *__base,size_t __nmemb,size_t __size,
                        __compar_fn_t __compar)

{
  long lVar1;
  FreqIt *this;
  undefined8 uVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined8 local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined8 local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined8 local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  FreqIt_S local_40;
  
  uVar5 = 0xffffffff;
  if ((int)__key <= (int)__base) {
    uVar5 = ((int)__base + (int)__key) / 2;
    lVar1 = **(long **)__nmemb;
    if ((ulong)((*(long **)__nmemb)[1] - lVar1 >> 4) <= (ulong)(long)(int)uVar5) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    this = *(FreqIt **)(lVar1 + (long)(int)uVar5 * 0x10);
    local_40.super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)__size;
    local_40.super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__size + 8);
    if (local_40.super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
      }
    }
    iVar3 = FreqIt::compare(this,&local_40,(int)__compar);
    if (local_40.super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (iVar3 != 0) {
      uVar2 = *(undefined8 *)__nmemb;
      if (iVar3 < 0) {
        local_48 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__nmemb + 8);
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_48->_M_use_count = local_48->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_48->_M_use_count = local_48->_M_use_count + 1;
          }
        }
        local_60 = *(undefined8 *)__size;
        local_58 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__size + 8);
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_58->_M_use_count = local_58->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_58->_M_use_count = local_58->_M_use_count + 1;
          }
        }
        local_50 = uVar2;
        pvVar4 = bsearch((void *)((ulong)__key & 0xffffffff),(void *)(ulong)(uVar5 - 1),
                         (size_t)&local_50,(size_t)&local_60,
                         (__compar_fn_t)((ulong)__compar & 0xffffffff));
        uVar5 = (uint)pvVar4;
        this_00 = local_48;
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          this_00 = local_48;
        }
      }
      else {
        local_68 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__nmemb + 8);
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_68->_M_use_count = local_68->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_68->_M_use_count = local_68->_M_use_count + 1;
          }
        }
        local_80 = *(undefined8 *)__size;
        local_78 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(__size + 8);
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_78->_M_use_count = local_78->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_78->_M_use_count = local_78->_M_use_count + 1;
          }
        }
        local_70 = uVar2;
        pvVar4 = bsearch((void *)(ulong)(uVar5 + 1),(void *)((ulong)__base & 0xffffffff),
                         (size_t)&local_70,(size_t)&local_80,
                         (__compar_fn_t)((ulong)__compar & 0xffffffff));
        uVar5 = (uint)pvVar4;
        this_00 = local_68;
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
          this_00 = local_68;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  return (void *)(ulong)uVar5;
}

Assistant:

int EqGrNode::bsearch(int min, int max, FreqIt_SS freqArray, FreqIt_S fit, int recursive) {
    int mid = (max + min) / 2;
    if (max < min) return -1;

    int res = freqArray->at(mid)->compare(fit, recursive);
    if (res == 0) return mid;
    else if (res < 0) return bsearch(min, mid - 1, freqArray, fit, recursive);
    else return bsearch(mid + 1, max, freqArray, fit, recursive);
}